

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2point_vector.cc
# Opt level: O3

vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *
s2coding::ConvertCellsToValues
          (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *__return_storage_ptr__,
          vector<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_> *cell_points,int level,
          bool *have_exceptions)

{
  pointer pCVar1;
  iterator iVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pCVar7;
  uint64 v;
  ulong local_48;
  S2LogMessage local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::reserve
            (__return_storage_ptr__,
             ((long)(cell_points->
                    super__Vector_base<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(cell_points->
                    super__Vector_base<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555);
  *have_exceptions = false;
  pCVar7 = (cell_points->
           super__Vector_base<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (cell_points->
           super__Vector_base<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar7 != pCVar1) {
    cVar3 = (char)level;
    do {
      if (pCVar7->level == level) {
        uVar5 = (ulong)((pCVar7->si >> 1 | (uint)(byte)pCVar7->face << 0x1e) >>
                       (0x1eU - cVar3 & 0x1f));
        uVar4 = (ulong)((((byte)pCVar7->face & 0xfffffffc) << 0x1d | pCVar7->ti) >>
                       (0x1fU - cVar3 & 0x1f));
        uVar5 = (uVar5 << 0x10 | uVar5) & 0xffff0000ffff;
        uVar6 = (uVar4 << 0x10 | uVar4) & 0xffff0000ffff;
        uVar4 = (uVar5 << 8 | uVar5) & 0xff00ff00ff00ff;
        uVar5 = (uVar6 << 8 | uVar6) & 0xff00ff00ff00ff;
        uVar6 = (uVar4 << 4 | uVar4) & 0xf0f0f0f0f0f0f0f;
        uVar4 = (uVar5 << 4 | uVar5) & 0xf0f0f0f0f0f0f0f;
        local_48 = (uVar4 << 2 | uVar4 << 4) & 0xcccccccccccccccc |
                   (uVar6 * 4 | uVar6) & 0x3333333333333333;
        if (0xffffffffffffffffU >> (cVar3 * -2 + 0x3dU & 0x3f) < local_48) {
          S2LogMessage::S2LogMessage
                    (&local_40,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                     ,0x24f,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_40.stream_,"Check failed: (v) <= (BitMask(MaxBitsForLevel(level))) ",0x37
                    );
          abort();
        }
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
          _M_realloc_insert<unsigned_long_long_const&>
                    ((vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
                     __return_storage_ptr__,iVar2,&local_48);
        }
        else {
          *iVar2._M_current = local_48;
          (__return_storage_ptr__->
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
      }
      else {
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
          _M_realloc_insert<unsigned_long_long_const&>
                    ((vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
                     __return_storage_ptr__,iVar2,&kException);
        }
        else {
          *iVar2._M_current = 0xffffffffffffffff;
          (__return_storage_ptr__->
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        *have_exceptions = true;
      }
      pCVar7 = pCVar7 + 1;
    } while (pCVar7 != pCVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<uint64> ConvertCellsToValues(const vector<CellPoint>& cell_points,
                                    int level, bool* have_exceptions) {
  vector<uint64> values;
  values.reserve(cell_points.size());
  *have_exceptions = false;
  int shift = S2CellId::kMaxLevel - level;
  for (CellPoint cp : cell_points) {
    if (cp.level != level) {
      values.push_back(kException);
      *have_exceptions = true;
    } else {
      // Note that bit 31 of tj is always zero, and that bits are interleaved in
      // such a way that bit 63 of the result is always zero.
      //
      // The S2CellId version of the following code is:
      // uint64 v = S2CellId::FromFaceIJ(cp.face, cp.si >> 1, cp.ti >> 1).
      //            parent(level).id() >> (2 * shift + 1);
      uint32 sj = (((cp.face & 3) << 30) | (cp.si >> 1)) >> shift;
      uint32 tj = (((cp.face & 4) << 29) | cp.ti) >> (shift + 1);
      uint64 v = InterleaveUint32BitPairs(sj, tj);
      S2_DCHECK_LE(v, BitMask(MaxBitsForLevel(level)));
      values.push_back(v);
    }
  }
  return values;
}